

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

libcaption_stauts_t caption_frame_decode_control(caption_frame_t *frame,uint16_t cc_data)

{
  eia608_control_t eVar1;
  uint16_t in_SI;
  long in_RDI;
  eia608_control_t cmd;
  int cc;
  int local_18 [2];
  long local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  libcaption_stauts_t lVar2;
  
  local_10 = in_RDI;
  eVar1 = eia608_parse_control(in_SI,local_18);
  if (eVar1 == eia608_control_resume_caption_loading) {
    *(byte *)(local_10 + 0x38) = *(byte *)(local_10 + 0x38) & 0xcf;
    *(long *)(local_10 + 0x1e40) = local_10 + 0xf40;
    lVar2 = LIBCAPTION_OK;
  }
  else if (eVar1 == eia608_control_backspace) {
    lVar2 = caption_frame_backspace((caption_frame_t *)0x142100001421);
  }
  else {
    if (1 < eVar1 - eia608_control_alarm_off) {
      if (eVar1 == eia608_control_delete_to_end_of_row) {
        lVar2 = caption_frame_delete_to_end_of_row((caption_frame_t *)0x142400001424);
        return lVar2;
      }
      if (eVar1 == eia608_control_roll_up_2) {
        *(byte *)(local_10 + 0x38) = *(byte *)(local_10 + 0x38) & 0xcf | 0x10;
        *(long *)(local_10 + 0x1e40) = local_10 + 0x40;
        return LIBCAPTION_OK;
      }
      if (eVar1 == eia608_control_roll_up_3) {
        *(byte *)(local_10 + 0x38) = *(byte *)(local_10 + 0x38) & 0xcf | 0x20;
        *(long *)(local_10 + 0x1e40) = local_10 + 0x40;
        return LIBCAPTION_OK;
      }
      if (eVar1 == eia608_control_roll_up_4) {
        *(byte *)(local_10 + 0x38) = *(byte *)(local_10 + 0x38) & 0xcf | 0x30;
        *(long *)(local_10 + 0x1e40) = local_10 + 0x40;
        return LIBCAPTION_OK;
      }
      if (eVar1 == eia608_control_resume_direct_captioning) {
        *(byte *)(local_10 + 0x38) = *(byte *)(local_10 + 0x38) & 0xcf;
        *(long *)(local_10 + 0x1e40) = local_10 + 0x40;
        return LIBCAPTION_OK;
      }
      if (1 < eVar1 - eia608_control_text_restart) {
        if (eVar1 == eia608_control_erase_display_memory) {
          caption_frame_buffer_clear((caption_frame_buffer_t *)0x1056eb);
          return LIBCAPTION_READY;
        }
        if (eVar1 == eia608_control_carriage_return) {
          lVar2 = caption_frame_carriage_return
                            ((caption_frame_t *)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
          return lVar2;
        }
        if (eVar1 == eia608_control_erase_non_displayed_memory) {
          caption_frame_buffer_clear((caption_frame_buffer_t *)0x10580e);
          return LIBCAPTION_OK;
        }
        if (eVar1 == eia608_control_end_of_caption) {
          lVar2 = caption_frame_end((caption_frame_t *)0x105822);
          return lVar2;
        }
        if (eVar1 - eia608_tab_offset_0 < 4) {
          *(char *)(local_10 + 0x3a) = *(char *)(local_10 + 0x3a) + (char)eVar1 + -0x20;
          return LIBCAPTION_OK;
        }
      }
    }
    lVar2 = LIBCAPTION_OK;
  }
  return lVar2;
}

Assistant:

libcaption_stauts_t caption_frame_decode_control(caption_frame_t* frame, uint16_t cc_data)
{
    int cc;
    eia608_control_t cmd = eia608_parse_control(cc_data, &cc);

    switch (cmd) {
    // PAINT ON
    case eia608_control_resume_direct_captioning:
        frame->state.rup = 0;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_erase_display_memory:
        caption_frame_buffer_clear(&frame->front);
        return LIBCAPTION_READY;

    // ROLL-UP
    case eia608_control_roll_up_2:
        frame->state.rup = 1;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_3:
        frame->state.rup = 2;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_roll_up_4:
        frame->state.rup = 3;
        frame->write = &frame->front;
        return LIBCAPTION_OK;

    case eia608_control_carriage_return:
        return caption_frame_carriage_return(frame);

    // Corrections (Is this only valid as part of paint on?)
    case eia608_control_backspace:
        return caption_frame_backspace(frame);
    case eia608_control_delete_to_end_of_row:
        return caption_frame_delete_to_end_of_row(frame);

    // POP ON
    case eia608_control_resume_caption_loading:
        frame->state.rup = 0;
        frame->write = &frame->back;
        return LIBCAPTION_OK;

    case eia608_control_erase_non_displayed_memory:
        caption_frame_buffer_clear(&frame->back);
        return LIBCAPTION_OK;

    case eia608_control_end_of_caption:
        return caption_frame_end(frame);

    // cursor positioning
    case eia608_tab_offset_0:
    case eia608_tab_offset_1:
    case eia608_tab_offset_2:
    case eia608_tab_offset_3:
        frame->state.col += (cmd - eia608_tab_offset_0);
        return LIBCAPTION_OK;

    // Unhandled
    default:
    case eia608_control_alarm_off:
    case eia608_control_alarm_on:
    case eia608_control_text_restart:
    case eia608_control_text_resume_text_display:
        return LIBCAPTION_OK;
    }
}